

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uLong cm_zlib_crc32(unsigned_long crc,uchar *buf,uint len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  
  if (buf == (uchar *)0x0) {
    return 0;
  }
  uVar2 = ~(uint)crc;
  for (puVar4 = buf; (len != 0 && (((ulong)puVar4 & 3) != 0)); puVar4 = puVar4 + 1) {
    uVar3 = *(uint *)buf;
    buf = (uchar *)((long)buf + 1);
    uVar2 = uVar2 >> 8 ^ (uint)crc_table[0][(byte)((byte)uVar3 ^ (byte)uVar2)];
    len = len - 1;
  }
  for (; 0x1f < len; len = len - 0x20) {
    uVar2 = uVar2 ^ *(uint *)buf;
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 4);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 8);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0xc);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x10);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x14);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x18);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18] ^ *(uint *)((long)buf + 0x1c);
    buf = (uchar *)((long)buf + 0x20);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18];
  }
  for (; 3 < len; len = len - 4) {
    uVar2 = uVar2 ^ *(uint *)buf;
    buf = (uchar *)((long)buf + 4);
    uVar2 = (uint)crc_table[2][uVar2 >> 8 & 0xff] ^ (uint)crc_table[3][uVar2 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar2 >> 0xd & 0x7f8)) ^
            (uint)crc_table[0][uVar2 >> 0x18];
  }
  if (len != 0) {
    uVar3 = 0;
    do {
      uVar1 = *(uint *)buf;
      buf = (uchar *)((long)buf + 1);
      uVar2 = uVar2 >> 8 ^ (uint)crc_table[0][(byte)((byte)uVar1 ^ (byte)uVar2)];
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
  }
  return (ulong)~uVar2;
}

Assistant:

unsigned long ZEXPORT crc32(crc, buf, len)
    unsigned long crc;
    const unsigned char FAR *buf;
    unsigned len;
{
    if (buf == Z_NULL) return 0UL;

#ifdef DYNAMIC_CRC_TABLE
    if (crc_table_empty)
        make_crc_table();
#endif /* DYNAMIC_CRC_TABLE */

#ifdef BYFOUR
    if (sizeof(void *) == sizeof(ptrdiff_t)) {
        u4 endian;

        endian = 1;
        if (*((unsigned char *)(&endian)))
            return crc32_little(crc, buf, len);
        else
            return crc32_big(crc, buf, len);
    }
#endif /* BYFOUR */
    crc = crc ^ 0xffffffffUL;
    while (len >= 8) {
        DO8;
        len -= 8;
    }
    if (len) do {
        DO1;
    } while (--len);
    return crc ^ 0xffffffffUL;
}